

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v7::detail::count_digits<4u,fmt::v7::detail::fallback_uintptr>(fallback_uintptr n)

{
  bool bVar1;
  int local_20;
  int local_14;
  int char_digits;
  int i;
  fallback_uintptr n_local;
  
  _char_digits = n.value;
  local_14 = 7;
  while( true ) {
    bVar1 = false;
    if (0 < local_14) {
      bVar1 = *(char *)((long)&char_digits + (long)local_14) == '\0';
    }
    if (!bVar1) break;
    local_14 = local_14 + -1;
  }
  if (local_14 < 0) {
    local_20 = 1;
  }
  else {
    local_20 = count_digits<4u,unsigned_int>((uint)*(byte *)((long)&char_digits + (long)local_14));
    local_20 = local_14 * 2 + local_20;
  }
  return local_20;
}

Assistant:

FMT_FUNC int count_digits<4>(detail::fallback_uintptr n) {
  // fallback_uintptr is always stored in little endian.
  int i = static_cast<int>(sizeof(void*)) - 1;
  while (i > 0 && n.value[i] == 0) --i;
  auto char_digits = std::numeric_limits<unsigned char>::digits / 4;
  return i >= 0 ? i * char_digits + count_digits<4, unsigned>(n.value[i]) : 1;
}